

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_get_tile_dim(fitsfile *fptr,int ndim,long *dims,int *status)

{
  int local_34;
  int ii;
  int *status_local;
  long *dims_local;
  int ndim_local;
  fitsfile *fptr_local;
  
  if ((ndim < 0) || (6 < ndim)) {
    *status = 0x140;
    ffpmsg("illegal number of tile dimensions (fits_get_tile_dim)");
    fptr_local._4_4_ = *status;
  }
  else {
    for (local_34 = 0; local_34 < ndim; local_34 = local_34 + 1) {
      dims[local_34] = fptr->Fptr->request_tilesize[local_34];
    }
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_get_tile_dim(fitsfile *fptr,  /* I - FITS file pointer             */
           int ndim,   /* number of dimensions in the compressed image      */
           long *dims, /* size of image compression tile in each dimension  */
                       /* default tile size = (NAXIS1, 1, 1, ...)           */
           int *status)         /* IO - error status                        */
{
/*
   This routine returns the size (dimension) of the image
   compression  tiles that should be used when writing a FITS
   image.  The image is divided into tiles, and each tile is compressed
   and stored in a row of at variable length binary table column.
*/
    int ii;

    if (ndim < 0 || ndim > MAX_COMPRESS_DIM)
    {
        *status = BAD_DIMEN;
	ffpmsg("illegal number of tile dimensions (fits_get_tile_dim)");
        return(*status);
    }

    for (ii = 0; ii < ndim; ii++)
    {
        dims[ii] = (fptr->Fptr)->request_tilesize[ii];
    }

    return(*status);
}